

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

PointerType * __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::GetInvalidSchemaPointer
          (PointerType *__return_storage_ptr__,
          GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
          *this)

{
  char *pcVar1;
  long lVar2;
  
  if ((this->schemaStack_).stackTop_ == (this->schemaStack_).stack_) {
    __return_storage_ptr__->tokenCount_ = 0;
    __return_storage_ptr__->parseErrorOffset_ = 0;
    __return_storage_ptr__->nameBuffer_ = (Ch *)0x0;
    __return_storage_ptr__->tokens_ = (Token *)0x0;
    __return_storage_ptr__->allocator_ = (CrtAllocator *)0x0;
    __return_storage_ptr__->ownAllocator_ = (CrtAllocator *)0x0;
    __return_storage_ptr__->parseErrorCode_ = kPointerParseErrorNone;
  }
  else {
    pcVar1 = (this->schemaStack_).stackTop_;
    if ((ulong)((long)pcVar1 - (long)(this->schemaStack_).stack_) < 0x90) {
      __assert_fail("GetSize() >= sizeof(T)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                    ,0x98,
                    "const T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Top() const [Allocator = rapidjson::CrtAllocator, T = rapidjson::internal::SchemaValidationContext<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<>>>>]"
                   );
    }
    lVar2 = *(long *)(pcVar1 + -0x80);
    __return_storage_ptr__->tokenCount_ = 0;
    __return_storage_ptr__->parseErrorOffset_ = 0;
    __return_storage_ptr__->nameBuffer_ = (Ch *)0x0;
    __return_storage_ptr__->tokens_ = (Token *)0x0;
    __return_storage_ptr__->allocator_ = (CrtAllocator *)0x0;
    __return_storage_ptr__->ownAllocator_ = (CrtAllocator *)0x0;
    __return_storage_ptr__->parseErrorCode_ = kPointerParseErrorNone;
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::operator=(__return_storage_ptr__,
                (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                 *)(lVar2 + 0x68));
  }
  return __return_storage_ptr__;
}

Assistant:

PointerType GetInvalidSchemaPointer() const {
        return schemaStack_.Empty() ? PointerType() : CurrentSchema().GetPointer();
    }